

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argh.h
# Opt level: O2

string_stream * __thiscall
argh::parser::operator()(string_stream *__return_storage_ptr__,parser *this,size_t ind,int *def_val)

{
  pointer pbVar1;
  ostringstream ostr;
  string local_1b0;
  long local_190;
  undefined8 local_188 [46];
  
  pbVar1 = (this->pos_args_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (ind < (ulong)((long)(this->pos_args_).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5)) {
    stringstream_proxy::stringstream_proxy(__return_storage_ptr__,pbVar1 + ind);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_190);
    *(undefined8 *)((long)local_188 + *(long *)(local_190 + -0x18)) = 0x15;
    std::ostream::operator<<((ostringstream *)&local_190,*def_val);
    std::__cxx11::stringbuf::str();
    stringstream_proxy::stringstream_proxy(__return_storage_ptr__,&local_1b0);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_190);
  }
  return __return_storage_ptr__;
}

Assistant:

string_stream parser::operator()(size_t ind, T&& def_val) const
   {
      if (pos_args_.size() <= ind)
      {
         std::ostringstream ostr;
         ostr.precision(std::numeric_limits<long double>::max_digits10);
         ostr << def_val;
         return string_stream(ostr.str());
      }

      return string_stream(pos_args_[ind]);
   }